

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultVerify.cpp
# Opt level: O1

void mult_verify::MultVerifyInt8Int8(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  long lVar3;
  char *__end;
  string local_50;
  
  paVar1 = &local_50.field_2;
  lVar3 = 2;
  do {
    iVar2 = (int)*(char *)(lVar3 + 0x1748af) * (int)*(char *)(lVar3 + 0x1748ae);
    if ((bool)(&int8_int8)[lVar3] != ((char)iVar2 == iVar2)) {
      local_50._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"Error in case int8_int8: ","");
      err_msg<unsigned_int,unsigned_int>
                (&local_50,(int)*(char *)(lVar3 + 0x1748ae),(int)*(char *)(lVar3 + 0x1748af),
                 (bool)(&int8_int8)[lVar3]);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != paVar1) {
        operator_delete(local_50._M_dataplus._M_p);
      }
    }
    iVar2 = (int)*(char *)(lVar3 + 0x1748af) * (int)*(char *)(lVar3 + 0x1748ae);
    if ((char)iVar2 != iVar2) {
      safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>::SafeIntOnOverflow();
    }
    if ((&int8_int8)[lVar3] != '\x01') {
      local_50._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"Error in case int8_int8 throw: ","");
      err_msg<unsigned_int,unsigned_int>
                (&local_50,(int)*(char *)(lVar3 + 0x1748ae),(int)*(char *)(lVar3 + 0x1748af),
                 (bool)(&int8_int8)[lVar3]);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != paVar1) {
        operator_delete(local_50._M_dataplus._M_p);
      }
    }
    lVar3 = lVar3 + 3;
  } while (lVar3 != 0x1bb);
  return;
}

Assistant:

void MultVerifyInt8Int8()
{
	size_t i;

	for( i = 0; i < COUNTOF(int8_int8); ++i )
	{
		std::int8_t ret;
		if( SafeMultiply(int8_int8[i].x, int8_int8[i].y, ret) != int8_int8[i].fExpected )
		{
			//assert(false);
			err_msg( "Error in case int8_int8: ", (unsigned int)int8_int8[i].x, (unsigned int)int8_int8[i].y, int8_int8[i].fExpected );
		}

		// Now test throwing version
		bool fSuccess = true;
		try
		{
			SafeInt<std::int8_t> si(int8_int8[i].x);
			si *= int8_int8[i].y;
		}
		catch(...)
		{
			fSuccess = false;
		}

		if( fSuccess != int8_int8[i].fExpected )
		{
			err_msg( "Error in case int8_int8 throw: ", (unsigned int)int8_int8[i].x, (unsigned int)int8_int8[i].y, int8_int8[i].fExpected );
		}
	}
}